

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printMSRMaskOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  uint local_38;
  uint Opcode;
  uint SYSm;
  uint reg;
  uint Mask;
  uint SpecRegRBit;
  MCOperand *Op;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar2 = MCOperand_getImm(op);
  uVar3 = MCOperand_getImm(op);
  uVar1 = (uint)uVar3 & 0xf;
  uVar4 = ARM_getFeatureBits(MI->csh->mode);
  if ((uVar4 & 0x10000) == 0) {
    if (((uVar2 >> 4 & 0xfffffff) != 0) || (((uVar1 != 8 && (uVar1 != 4)) && (uVar1 != 0xc)))) {
      Opcode = 0;
      if ((uVar2 >> 4 & 0xfffffff) == 0) {
        SStream_concat0(O,"cpsr");
        if ((uVar3 & 0xf) == 0) {
          return;
        }
        SStream_concat0(O,"_");
        if ((uVar3 & 8) != 0) {
          SStream_concat0(O,"f");
          Opcode = 0x80;
        }
        if ((uVar3 & 4) != 0) {
          SStream_concat0(O,"s");
          Opcode = Opcode + 0x40;
        }
        if ((uVar3 & 2) != 0) {
          SStream_concat0(O,"x");
          Opcode = Opcode + 0x20;
        }
        if ((uVar3 & 1) != 0) {
          SStream_concat0(O,"c");
          Opcode = Opcode + 0x10;
        }
        ARM_addSysReg(MI,Opcode);
        return;
      }
      SStream_concat0(O,"spsr");
      if ((uVar3 & 0xf) == 0) {
        return;
      }
      SStream_concat0(O,"_");
      if ((uVar3 & 8) != 0) {
        SStream_concat0(O,"f");
        Opcode = 8;
      }
      if ((uVar3 & 4) != 0) {
        SStream_concat0(O,"s");
        Opcode = Opcode + 4;
      }
      if ((uVar3 & 2) != 0) {
        SStream_concat0(O,"x");
        Opcode = Opcode + 2;
      }
      if ((uVar3 & 1) != 0) {
        SStream_concat0(O,"c");
        Opcode = Opcode + 1;
      }
      ARM_addSysReg(MI,Opcode);
      return;
    }
    SStream_concat0(O,"apsr_");
    if (uVar1 != 4) {
      if (uVar1 == 8) {
        SStream_concat0(O,"nzcvq");
        ARM_addSysReg(MI,ARM_SYSREG_APSR_NZCVQ);
        return;
      }
      if (uVar1 == 0xc) {
        SStream_concat0(O,"nzcvqg");
        ARM_addSysReg(MI,ARM_SYSREG_APSR_NZCVQG);
        return;
      }
    }
    SStream_concat0(O,"g");
    ARM_addSysReg(MI,ARM_SYSREG_APSR_G);
    return;
  }
  iVar5 = MCOperand_getImm(op);
  local_38 = (uint)iVar5;
  uVar1 = MCInst_getOpcode(MI);
  if (uVar1 == 0x999) {
    local_38 = local_38 & 0xff;
  }
  if (local_38 != 0) {
    if (local_38 == 1) {
LAB_0018942e:
      SStream_concat0(O,"iapsr");
      ARM_addSysReg(MI,ARM_SYSREG_IAPSR);
      return;
    }
    if (local_38 == 2) {
LAB_00189497:
      SStream_concat0(O,"eapsr");
      ARM_addSysReg(MI,ARM_SYSREG_EAPSR);
      return;
    }
    if (local_38 == 3) {
LAB_00189500:
      SStream_concat0(O,"xpsr");
      ARM_addSysReg(MI,ARM_SYSREG_XPSR);
      return;
    }
    if (local_38 == 5) {
LAB_00189569:
      SStream_concat0(O,"ipsr");
      ARM_addSysReg(MI,ARM_SYSREG_IPSR);
      return;
    }
    if (local_38 == 6) {
LAB_0018958c:
      SStream_concat0(O,"epsr");
      ARM_addSysReg(MI,ARM_SYSREG_EPSR);
      return;
    }
    if (local_38 == 7) {
LAB_001895af:
      SStream_concat0(O,"iepsr");
      ARM_addSysReg(MI,ARM_SYSREG_IEPSR);
      return;
    }
    if (local_38 == 8) {
LAB_001895d2:
      SStream_concat0(O,"msp");
      ARM_addSysReg(MI,ARM_SYSREG_MSP);
      return;
    }
    if (local_38 == 9) {
LAB_001895f5:
      SStream_concat0(O,"psp");
      ARM_addSysReg(MI,ARM_SYSREG_PSP);
      return;
    }
    if (local_38 == 0x10) {
LAB_00189618:
      SStream_concat0(O,"primask");
      ARM_addSysReg(MI,ARM_SYSREG_PRIMASK);
      return;
    }
    if (local_38 == 0x11) {
LAB_0018963b:
      SStream_concat0(O,"basepri");
      ARM_addSysReg(MI,ARM_SYSREG_BASEPRI);
      return;
    }
    if (local_38 == 0x12) {
LAB_0018965e:
      SStream_concat0(O,"basepri_max");
      ARM_addSysReg(MI,ARM_SYSREG_BASEPRI_MAX);
      return;
    }
    if (local_38 == 0x13) {
LAB_00189681:
      SStream_concat0(O,"faultmask");
      ARM_addSysReg(MI,ARM_SYSREG_FAULTMASK);
      return;
    }
    if (local_38 == 0x14) {
LAB_001896a4:
      SStream_concat0(O,"control");
      ARM_addSysReg(MI,ARM_SYSREG_CONTROL);
      return;
    }
    if (local_38 == 0x400) {
      SStream_concat0(O,"apsr_g");
      ARM_addSysReg(MI,ARM_SYSREG_APSR_G);
      return;
    }
    if (local_38 == 0x401) {
      SStream_concat0(O,"iapsr_g");
      ARM_addSysReg(MI,ARM_SYSREG_IAPSR_G);
      return;
    }
    if (local_38 == 0x402) {
      SStream_concat0(O,"eapsr_g");
      ARM_addSysReg(MI,ARM_SYSREG_EAPSR_G);
      return;
    }
    if (local_38 == 0x403) {
      SStream_concat0(O,"xpsr_g");
      ARM_addSysReg(MI,ARM_SYSREG_XPSR_G);
      return;
    }
    if (local_38 != 0x800) {
      if (local_38 == 0x801) goto LAB_0018942e;
      if (local_38 == 0x802) goto LAB_00189497;
      if (local_38 == 0x803) goto LAB_00189500;
      if (local_38 == 0x805) goto LAB_00189569;
      if (local_38 == 0x806) goto LAB_0018958c;
      if (local_38 == 0x807) goto LAB_001895af;
      if (local_38 == 0x808) goto LAB_001895d2;
      if (local_38 == 0x809) goto LAB_001895f5;
      if (local_38 == 0x810) goto LAB_00189618;
      if (local_38 == 0x811) goto LAB_0018963b;
      if (local_38 == 0x812) goto LAB_0018965e;
      if (local_38 == 0x813) goto LAB_00189681;
      if (local_38 == 0x814) goto LAB_001896a4;
      if (local_38 == 0xc00) {
        SStream_concat0(O,"apsr_nzcvqg");
        ARM_addSysReg(MI,ARM_SYSREG_APSR_NZCVQG);
        return;
      }
      if (local_38 == 0xc01) {
        SStream_concat0(O,"iapsr_nzcvqg");
        ARM_addSysReg(MI,ARM_SYSREG_IAPSR_NZCVQG);
        return;
      }
      if (local_38 == 0xc02) {
        SStream_concat0(O,"eapsr_nzcvqg");
        ARM_addSysReg(MI,ARM_SYSREG_EAPSR_NZCVQG);
        return;
      }
      if (local_38 == 0xc03) {
        SStream_concat0(O,"xpsr_nzcvqg");
        ARM_addSysReg(MI,ARM_SYSREG_XPSR_NZCVQG);
        return;
      }
    }
  }
  SStream_concat0(O,"apsr");
  ARM_addSysReg(MI,ARM_SYSREG_APSR);
  return;
}

Assistant:

static void printMSRMaskOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);
	unsigned SpecRegRBit = (unsigned)MCOperand_getImm(Op) >> 4;
	unsigned Mask = MCOperand_getImm(Op) & 0xf;
	unsigned reg;

	if (ARM_getFeatureBits(MI->csh->mode) & ARM_FeatureMClass) {
		unsigned SYSm = (unsigned)MCOperand_getImm(Op);
		unsigned Opcode = MCInst_getOpcode(MI);
		// For reads of the special registers ignore the "mask encoding" bits
		// which are only for writes.
		if (Opcode == ARM_t2MRS_M)
			SYSm &= 0xff;
		switch (SYSm) {
			default: //llvm_unreachable("Unexpected mask value!");
			case     0:
			case 0x800: SStream_concat0(O, "apsr"); ARM_addSysReg(MI, ARM_SYSREG_APSR); return; // with _nzcvq bits is an alias for aspr
			case 0x400: SStream_concat0(O, "apsr_g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
			case 0xc00: SStream_concat0(O, "apsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
			case     1:
			case 0x801: SStream_concat0(O, "iapsr"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR); return; // with _nzcvq bits is an alias for iapsr
			case 0x401: SStream_concat0(O, "iapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_G); return;
			case 0xc01: SStream_concat0(O, "iapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_NZCVQG); return;
			case     2:
			case 0x802: SStream_concat0(O, "eapsr"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR); return; // with _nzcvq bits is an alias for eapsr
			case 0x402: SStream_concat0(O, "eapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_G); return;
			case 0xc02: SStream_concat0(O, "eapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_NZCVQG); return;
			case     3:
			case 0x803: SStream_concat0(O, "xpsr"); ARM_addSysReg(MI, ARM_SYSREG_XPSR); return; // with _nzcvq bits is an alias for xpsr
			case 0x403: SStream_concat0(O, "xpsr_g"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_G); return;
			case 0xc03: SStream_concat0(O, "xpsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_NZCVQG); return;
			case     5:
			case 0x805: SStream_concat0(O, "ipsr"); ARM_addSysReg(MI, ARM_SYSREG_IPSR); return;
			case     6:
			case 0x806: SStream_concat0(O, "epsr"); ARM_addSysReg(MI, ARM_SYSREG_EPSR); return;
			case     7:
			case 0x807: SStream_concat0(O, "iepsr"); ARM_addSysReg(MI, ARM_SYSREG_IEPSR); return;
			case     8:
			case 0x808: SStream_concat0(O, "msp"); ARM_addSysReg(MI, ARM_SYSREG_MSP); return;
			case     9:
			case 0x809: SStream_concat0(O, "psp"); ARM_addSysReg(MI, ARM_SYSREG_PSP); return;
			case  0x10:
			case 0x810: SStream_concat0(O, "primask"); ARM_addSysReg(MI, ARM_SYSREG_PRIMASK); return;
			case  0x11:
			case 0x811: SStream_concat0(O, "basepri"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI); return;
			case  0x12:
			case 0x812: SStream_concat0(O, "basepri_max"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI_MAX); return;
			case  0x13:
			case 0x813: SStream_concat0(O, "faultmask"); ARM_addSysReg(MI, ARM_SYSREG_FAULTMASK); return;
			case  0x14:
			case 0x814: SStream_concat0(O, "control"); ARM_addSysReg(MI, ARM_SYSREG_CONTROL); return;
		}
	}

	// As special cases, CPSR_f, CPSR_s and CPSR_fs prefer printing as
	// APSR_nzcvq, APSR_g and APSRnzcvqg, respectively.
	if (!SpecRegRBit && (Mask == 8 || Mask == 4 || Mask == 12)) {
		SStream_concat0(O, "apsr_");
		switch (Mask) {
			default: // llvm_unreachable("Unexpected mask value!");
			case 4:  SStream_concat0(O, "g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
			case 8:  SStream_concat0(O, "nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQ); return;
			case 12: SStream_concat0(O, "nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
		}
	}

	reg = 0;
	if (SpecRegRBit) {
		SStream_concat0(O, "spsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_SPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_SPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_SPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_SPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	} else {
		SStream_concat0(O, "cpsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_CPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_CPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_CPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_CPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	}
}